

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainManager.hpp
# Opt level: O1

void __thiscall sjtu::TrainManager::query_train(TrainManager *this,int argc,string *argv)

{
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this_00;
  TrainManager *pTVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  invalid_command *this_01;
  long lVar4;
  ulong uVar5;
  string *psVar6;
  long lVar7;
  int iVar8;
  pair<long,_bool> pVar9;
  string date;
  string trainID;
  undefined1 *local_e0;
  long local_d8;
  undefined1 local_d0;
  undefined7 uStack_cf;
  undefined1 *local_c0;
  long local_b8;
  undefined1 local_b0;
  undefined7 uStack_af;
  TrainManager *local_a0;
  long *local_98;
  long local_90;
  long local_88 [2];
  long local_78;
  char local_70;
  string local_68;
  ulong local_48;
  timeType local_40;
  
  local_c0 = &local_b0;
  iVar8 = 0;
  local_b8 = 0;
  local_b0 = 0;
  local_e0 = &local_d0;
  local_d8 = 0;
  local_d0 = 0;
  local_a0 = this;
  if (0 < argc) {
    do {
      iVar2 = std::__cxx11::string::compare((char *)argv);
      psVar6 = (string *)&local_c0;
      if (iVar2 != 0) {
        iVar2 = std::__cxx11::string::compare((char *)argv);
        psVar6 = (string *)&local_e0;
        if (iVar2 != 0) {
          this_01 = (invalid_command *)__cxa_allocate_exception(0x68);
          invalid_command::invalid_command(this_01);
          __cxa_throw(this_01,&invalid_command::typeinfo,invalid_command::~invalid_command);
        }
      }
      std::__cxx11::string::_M_assign(psVar6);
      argv = argv + 2;
      iVar8 = iVar8 + 2;
    } while (iVar8 < argc);
  }
  pTVar1 = local_a0;
  this_00 = local_a0->TrainBpTree;
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char*>((string *)&local_98,local_c0,local_c0 + local_b8);
  if (local_90 == 0) {
    local_48 = 0;
  }
  else {
    lVar7 = 0;
    lVar4 = 0;
    local_48 = 0;
    do {
      uVar5 = (ulong)((int)*(char *)((long)local_98 + lVar7) + 0x100);
      lVar4 = (long)(lVar4 * 0x239 + uVar5) % 0x3b800001;
      local_48 = (long)(local_48 * 0x301 + uVar5) % 0x3b9aca07;
      lVar7 = lVar7 + 1;
    } while (local_90 != lVar7);
    local_48 = lVar4 << 0x20 | local_48;
  }
  pVar9 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                    (this_00,&local_48);
  local_78 = pVar9.first;
  local_70 = pVar9.second;
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  if (local_70 == '\0') {
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,-1);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
  }
  else {
    iVar8 = (*(pTVar1->TrainFile->super_FileManager_Base<sjtu::trainType>)._vptr_FileManager_Base[2]
            )(pTVar1->TrainFile,&local_78);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_68,local_e0,local_e0 + local_d8);
    timeType::timeType(&local_40,&local_68);
    trainType::display((trainType *)CONCAT44(extraout_var,iVar8),&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,CONCAT71(uStack_cf,local_d0) + 1);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,CONCAT71(uStack_af,local_b0) + 1);
  }
  return;
}

Assistant:

void query_train(int argc , std::string *argv)
		{
			std::string trainID , date;
			for (int i = 0;i < argc;i += 2)
				if (argv[i] == "-i") trainID = argv[i + 1];
				else if (argv[i] == "-d") date = argv[i + 1];
				else throw invalid_command();
			auto ret = TrainBpTree -> find(hasher(trainID));
			if (ret.second == false) std::cout << -1 << std::endl;
			else TrainFile -> read(ret.first) -> display(timeType(date));
		}